

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ItemSize(ImVec2 *size,float text_baseline_y)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar5 = 0.0;
    if (0.0 <= text_baseline_y) {
      fVar5 = (pIVar1->DC).CurrLineTextBaseOffset - text_baseline_y;
      fVar5 = (float)(~-(uint)(fVar5 <= 0.0) & (uint)fVar5);
    }
    fVar10 = (pIVar1->DC).CurrLineSize.y;
    fVar5 = fVar5 + size->y;
    uVar3 = -(uint)(fVar5 <= fVar10);
    fVar6 = (pIVar1->DC).CursorPos.x + size->x;
    fVar7 = (float)(uVar3 & (uint)fVar10 | ~uVar3 & (uint)fVar5);
    (pIVar1->DC).CursorPosPrevLine.x = fVar6;
    fVar5 = (pIVar1->DC).CursorPos.y;
    (pIVar1->DC).CursorPosPrevLine.y = fVar5;
    fVar10 = (pIVar2->Style).ItemSpacing.y;
    IVar11.x = (float)(int)((pIVar1->DC).ColumnsOffset.x + (pIVar1->DC).Indent.x + (pIVar1->Pos).x);
    IVar11.y = (float)(int)(fVar10 + fVar5 + fVar7);
    (pIVar1->DC).CursorPos = IVar11;
    fVar10 = IVar11.y - fVar10;
    IVar11 = (pIVar1->DC).CursorMaxPos;
    fVar8 = IVar11.x;
    fVar9 = IVar11.y;
    uVar3 = -(uint)(fVar6 <= fVar8);
    uVar4 = -(uint)(fVar10 <= fVar9);
    (pIVar1->DC).CursorMaxPos =
         (ImVec2)(CONCAT44(~uVar4 & (uint)fVar10,~uVar3 & (uint)fVar6) |
                 CONCAT44((uint)fVar9 & uVar4,(uint)fVar8 & uVar3));
    (pIVar1->DC).PrevLineSize.y = fVar7;
    (pIVar1->DC).CurrLineSize.y = 0.0;
    fVar10 = (pIVar1->DC).CurrLineTextBaseOffset;
    uVar3 = -(uint)(text_baseline_y <= fVar10);
    fVar10 = (float)(~uVar3 & (uint)text_baseline_y | (uint)fVar10 & uVar3);
    (pIVar1->DC).PrevLineTextBaseOffset = fVar10;
    (pIVar1->DC).CurrLineTextBaseOffset = 0.0;
    if ((pIVar1->DC).LayoutType == 0) {
      pIVar1->WriteAccessed = true;
      (pIVar1->DC).CursorPos.x = fVar6 + (pIVar2->Style).ItemSpacing.x;
      (pIVar1->DC).CursorPos.y = fVar5;
      (pIVar1->DC).CurrLineSize = (pIVar1->DC).PrevLineSize;
      (pIVar1->DC).CurrLineTextBaseOffset = fVar10;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_baseline_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // We increase the height in this function to accommodate for baseline offset.
    // In theory we should be offsetting the starting position (window->DC.CursorPos), that will be the topic of a larger refactor,
    // but since ItemSize() is not yet an API that moves the cursor (to handle e.g. wrapping) enlarging the height has the same effect.
    const float offset_to_match_baseline_y = (text_baseline_y >= 0) ? ImMax(0.0f, window->DC.CurrLineTextBaseOffset - text_baseline_y) : 0.0f;
    const float line_height = ImMax(window->DC.CurrLineSize.y, size.y + offset_to_match_baseline_y);

    // Always align ourselves on pixel boundaries
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine.x = window->DC.CursorPos.x + size.x;
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);    // Next line
    window->DC.CursorPos.y = IM_FLOOR(window->DC.CursorPos.y + line_height + g.Style.ItemSpacing.y);        // Next line
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.CurrLineSize.y = 0.0f;
    window->DC.PrevLineTextBaseOffset = ImMax(window->DC.CurrLineTextBaseOffset, text_baseline_y);
    window->DC.CurrLineTextBaseOffset = 0.0f;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}